

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_Leader::GetBBox
          (ON_OBSOLETE_V5_Leader *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  int c;
  ON_2dPoint *pOVar1;
  bool bVar2;
  undefined3 in_register_00000009;
  uint uVar3;
  byte bVar4;
  long lVar5;
  ON_BoundingBox bbox;
  ON_3dPointArray P;
  ON_BoundingBox local_90;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  uVar3 = CONCAT31(in_register_00000009,bGrowBox);
  ON_BoundingBox::ON_BoundingBox(&local_90);
  if (uVar3 != 0) {
    local_90.m_min.x = *boxmin;
    local_90.m_min.y = boxmin[1];
    local_90.m_min.z = boxmin[2];
    local_90.m_max.x = *boxmax;
    local_90.m_max.y = boxmax[1];
    local_90.m_max.z = boxmax[2];
    bVar2 = ON_BoundingBox::IsValid(&local_90);
    if (!bVar2) {
      ON_BoundingBox::Destroy(&local_90);
      uVar3 = 0;
    }
  }
  bVar4 = (byte)uVar3;
  c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (0 < (long)c) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,c);
    lVar5 = 0;
    do {
      pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      ON_Plane::PointAt(&local_48,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,
                        *(double *)((long)&pOVar1->x + lVar5),*(double *)((long)&pOVar1->y + lVar5))
      ;
      ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
      lVar5 = lVar5 + 0x10;
    } while ((long)c * 0x10 != lVar5);
    bVar2 = ON_3dPointArray::GetBoundingBox((ON_3dPointArray *)&local_60,&local_90,uVar3 & 0xff);
    bVar4 = bVar4 | bVar2;
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  if (bVar4 != 0) {
    *boxmin = local_90.m_min.x;
    boxmin[1] = local_90.m_min.y;
    boxmin[2] = local_90.m_min.z;
    *boxmax = local_90.m_max.x;
    boxmax[1] = local_90.m_max.y;
    boxmax[2] = local_90.m_max.z;
  }
  return (bool)bVar4;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  const int point_count = m_points.Count();
  if ( point_count > 0 )
  {
    ON_3dPointArray P(point_count);
    int i;
    for ( i = 0; i < point_count; i++ )
    {
      ON_2dPoint uv = m_points[i];
      P.Append( m_plane.PointAt(uv.x,uv.y));
    }
    if ( P.GetBoundingBox(bbox,bGrowBox?true:false) )
      bGrowBox = true;
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}